

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

char * sx__vsnprintf_callback(char *buff,void *user,int len)

{
  code *pcVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int *piVar5;
  char *pcVar6;
  char *str;
  uint uVar7;
  int iVar8;
  int *__dest;
  int iVar9;
  int *piVar10;
  
  iVar9 = len + 1;
  piVar10 = *(int **)((long)user + 8);
  if (piVar10 == (int *)0x0) {
    iVar8 = 0;
    iVar2 = 0;
  }
  else {
    iVar2 = piVar10[-1];
    iVar8 = iVar2 + iVar9;
    if (iVar8 < piVar10[-2]) goto LAB_00107c76;
    iVar8 = piVar10[-2] * 2;
  }
  iVar3 = iVar2 + iVar9;
  if (iVar2 + iVar9 < iVar8) {
    iVar3 = iVar8;
  }
  iVar2 = 8;
  if (8 < iVar3) {
    iVar2 = iVar3;
  }
  __dest = piVar10 + -2;
  if (piVar10 == (int *)0x0) {
    __dest = (int *)0x0;
  }
  iVar8 = iVar2 + 8;
  piVar5 = (int *)(*(code *)**user)(__dest,iVar8,0,
                                    "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c"
                                    ,"sx__vsnprintf_callback",0x45,(*user)[1]);
  if (piVar5 == (int *)0x0) {
    sx__vsnprintf_callback_cold_1();
    if (__dest == (int *)0x0) {
      sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c"
                        ,0x58,"dst");
      pcVar1 = (code *)swi(3);
      pcVar6 = (char *)(*pcVar1)();
      return pcVar6;
    }
    if (str != (char *)0x0) {
      uVar4 = sx_strlen(str);
      uVar7 = iVar8 - 1U;
      if ((int)uVar4 < (int)(iVar8 - 1U)) {
        uVar7 = uVar4;
      }
      if (0 < (int)uVar7) {
        memcpy(__dest,str,(ulong)uVar7);
      }
      *(undefined1 *)((long)__dest + (long)(int)uVar7) = 0;
      return (char *)((long)__dest + (long)(int)uVar7);
    }
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c",
                      0x59,"src");
    pcVar1 = (code *)swi(3);
    pcVar6 = (char *)(*pcVar1)();
    return pcVar6;
  }
  *piVar5 = iVar2;
  if (piVar10 == (int *)0x0) {
    piVar5[1] = 0;
  }
  piVar10 = piVar5 + 2;
  *(int **)((long)user + 8) = piVar10;
  iVar8 = iVar9 + piVar5[1];
LAB_00107c76:
  piVar10[-1] = iVar8;
  memcpy((void *)((long)*(int *)((long)user + 0x10) + (long)piVar10),(char *)((long)user + 0x14),
         (long)len);
  *(int *)((long)user + 0x10) = *(int *)((long)user + 0x10) + len;
  return (char *)((long)user + 0x14);
}

Assistant:

static char* sx__vsnprintf_callback(char* buff, void* user, int len)
{
    sx_unused(buff);
    sx__printf_ctx* ctx = (sx__printf_ctx*)user;
    int len_ = len + 1;    // Reserve one character for null-termination
    sx_array_add(ctx->alloc, ctx->buff, len_);
    sx_memcpy(ctx->buff + ctx->len, ctx->tmp, len);
    ctx->len += len;
    return ctx->tmp;
}